

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
* __thiscall helics::CommonCore::getAllValues(CommonCore *this,InterfaceHandle handle)

{
  string_view message;
  string_view message_00;
  pair<helics::route_id,_helics::ActionMessage> *ppVar1;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *__str;
  vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
  *pvVar2;
  size_t in_RDI;
  lock_guard<helics::FederateState> lock;
  FederateState *fed;
  pair<helics::route_id,_helics::ActionMessage> *handleInfo;
  CommonCore *in_stack_ffffffffffffff68;
  lock_guard<helics::FederateState> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  CommonCore *in_stack_ffffffffffffffa8;
  
  ppVar1 = getHandleInfo(in_stack_ffffffffffffff68,
                         (InterfaceHandle)(BaseType)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (ppVar1 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_ffffffffffffff78);
    message._M_str = in_stack_ffffffffffffff90;
    message._M_len = in_RDI;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  if ((char)(ppVar1->second).messageID != 'i') {
    __str = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff80,__str);
    message_00._M_str = in_stack_ffffffffffffff90;
    message_00._M_len = in_RDI;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_ffffffffffffff80,message_00);
    __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  getFederateAt(in_stack_ffffffffffffffa8,(LocalFederateId)(ppVar1->second).messageAction);
  std::lock_guard<helics::FederateState>::lock_guard
            (in_stack_ffffffffffffff70,(mutex_type *)in_stack_ffffffffffffff68);
  pvVar2 = FederateState::getAllValues
                     ((FederateState *)in_stack_ffffffffffffff68,
                      (InterfaceHandle)(BaseType)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  std::lock_guard<helics::FederateState>::~lock_guard((lock_guard<helics::FederateState> *)0x46fffb)
  ;
  return pvVar2;
}

Assistant:

const std::vector<std::shared_ptr<const SmallBuffer>>&
    CommonCore::getAllValues(InterfaceHandle handle)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle is invalid (getValue)"));
    }

    if (handleInfo->handleType != InterfaceType::INPUT) {
        throw(InvalidIdentifier("Handle does not identify an input"));
    }
    auto& fed = *getFederateAt(handleInfo->local_fed_id);
    const std::lock_guard<FederateState> lock(fed);
    return fed.getAllValues(handle);
}